

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall ccs::anon_unknown_0::Lexer::multilineComment(Lexer *this)

{
  undefined8 uVar1;
  int iVar2;
  string *psVar3;
  ostringstream _message;
  long local_1b8;
  long local_1b0;
  ostringstream local_198 [376];
  
  do {
    while (iVar2 = Buf::get(&this->stream_), iVar2 != 0x2a) {
      if (iVar2 == 0x2f) {
        iVar2 = std::istream::peek();
        if (iVar2 == 0x2a) {
          Buf::get(&this->stream_);
          multilineComment(this);
        }
      }
      else if (iVar2 == -1) {
        std::__cxx11::ostringstream::ostringstream(local_198);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_198,"Unterminated multi-line comment",0x1f);
        psVar3 = (string *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        uVar1 = *(undefined8 *)&(this->stream_).line_;
        *(string **)psVar3 = psVar3 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar3,local_1b8,local_1b0 + local_1b8);
        *(undefined8 *)(psVar3 + 0x20) = uVar1;
        __cxa_throw(psVar3,&(anonymous_namespace)::parse_error::typeinfo,parse_error::~parse_error);
      }
    }
    iVar2 = std::istream::peek();
  } while (iVar2 != 0x2f);
  Buf::get(&this->stream_);
  return;
}

Assistant:

void multilineComment() {
    while (true) {
      int c = stream_.get();
      if (c == EOF)
        THROW(stream_.location(), "Unterminated multi-line comment");
      if (c == '*' && stream_.peek() == '/') {
        stream_.get();
        return;
      }
      if (c == '/' && stream_.peek() == '*') {
        stream_.get();
        multilineComment();
      }
    }
  }